

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

BGZF * bgzf_dopen(int fd,char *mode)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  hFILE *phVar4;
  int *piVar5;
  hFILE *fpw;
  hFILE *fpr;
  BGZF *fp;
  char *mode_local;
  int fd_local;
  
  uVar2 = compressBound(0xff00);
  if (0xffff < uVar2) {
    __assert_fail("compressBound(BGZF_BLOCK_SIZE) < BGZF_MAX_BLOCK_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/bgzf.c"
                  ,0xc2,"BGZF *bgzf_dopen(int, const char *)");
  }
  pcVar3 = strchr(mode,0x72);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = strchr(mode,0x77);
    if ((pcVar3 == (char *)0x0) && (pcVar3 = strchr(mode,0x61), pcVar3 == (char *)0x0)) {
      piVar5 = __errno_location();
      *piVar5 = 0x16;
      return (BGZF *)0x0;
    }
    phVar4 = hdopen(fd,mode);
    if (phVar4 == (hFILE *)0x0) {
      return (BGZF *)0x0;
    }
    fpr = (hFILE *)bgzf_write_init(mode);
    ((BGZF *)fpr)->fp = phVar4;
  }
  else {
    phVar4 = hdopen(fd,mode);
    if (phVar4 == (hFILE *)0x0) {
      return (BGZF *)0x0;
    }
    fpr = (hFILE *)bgzf_read_init(phVar4);
    if ((BGZF *)fpr == (BGZF *)0x0) {
      hclose_abruptly(phVar4);
      return (BGZF *)0x0;
    }
    ((BGZF *)fpr)->fp = phVar4;
  }
  uVar1 = ed_is_big();
  *(uint *)&fpr->buffer = *(uint *)&fpr->buffer & 0xfff3ffff | (uVar1 & 3) << 0x12;
  return (BGZF *)fpr;
}

Assistant:

BGZF *bgzf_dopen(int fd, const char *mode)
{
    BGZF *fp = 0;
    assert(compressBound(BGZF_BLOCK_SIZE) < BGZF_MAX_BLOCK_SIZE);
    if (strchr(mode, 'r')) {
        hFILE *fpr;
        if ((fpr = hdopen(fd, mode)) == 0) return 0;
        fp = bgzf_read_init(fpr);
        if (fp == 0) { hclose_abruptly(fpr); return NULL; } // FIXME this closes fd
        fp->fp = fpr;
    } else if (strchr(mode, 'w') || strchr(mode, 'a')) {
        hFILE *fpw;
        if ((fpw = hdopen(fd, mode)) == 0) return 0;
        fp = bgzf_write_init(mode);
        fp->fp = fpw;
    }
    else { errno = EINVAL; return 0; }

    fp->is_be = ed_is_big();
    return fp;
}